

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcRoof::IfcRoof(IfcRoof *this)

{
  *(undefined ***)&this->field_0x178 = &PTR__Object_008278a0;
  *(undefined8 *)&this->field_0x180 = 0;
  *(char **)&this->field_0x188 = "IfcRoof";
  IfcBuildingElement::IfcBuildingElement
            ((IfcBuildingElement *)this,&PTR_construction_vtable_24__0086b708);
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoof,_1UL>).aux_is_derived.
  super__Base_bitset<1UL>._M_w = 0;
  *(undefined8 *)this = 0x86b5d8;
  *(undefined8 *)&this->field_0x178 = 0x86b6f0;
  *(undefined8 *)&this->field_0x88 = 0x86b600;
  *(undefined8 *)&this->field_0x98 = 0x86b628;
  *(undefined8 *)&this->field_0xd0 = 0x86b650;
  *(undefined8 *)&this->field_0x100 = 0x86b678;
  *(undefined8 *)&this->field_0x138 = 0x86b6a0;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoof,_1UL>)._vptr_ObjectHelper =
       (_func_int **)0x86b6c8;
  *(undefined1 **)&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoof,_1UL>).field_0x10 =
       &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoof,_1UL>).field_0x20;
  *(undefined8 *)&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoof,_1UL>).field_0x18 = 0;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoof,_1UL>).field_0x20 = 0;
  return;
}

Assistant:

IfcRoof() : Object("IfcRoof") {}